

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O2

void __thiscall dynamicgraph::Entity::addCommand(Entity *this,string *inName,Command *command)

{
  size_type sVar1;
  ExceptionFactory *this_00;
  ErrorCodeEnum local_74;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*>
  item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  sVar1 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*>_>_>
          ::count(&this->commandMap,inName);
  if (sVar1 == 0) {
    std::__cxx11::string::string((string *)&item,(string *)inName);
    item.second = command;
    std::
    _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>,std::_Select1st<std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>&>
              ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>,std::_Select1st<std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>>>
                *)&this->commandMap,&item);
    std::__cxx11::string::~string((string *)&item);
    return;
  }
  this_00 = (ExceptionFactory *)__cxa_allocate_exception(0x30);
  local_74 = OBJECT_CONFLICT;
  std::operator+(&local_48,"Command ",inName);
  std::operator+(&item.first,&local_48," already registered in Entity.");
  ExceptionFactory::ExceptionFactory(this_00,&local_74,&item.first);
  __cxa_throw(this_00,&ExceptionFactory::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

void Entity::addCommand(const std::string &inName, Command *command) {
  if (commandMap.count(inName) != 0) {
    DG_THROW ExceptionFactory(
        ExceptionFactory::OBJECT_CONFLICT,
        "Command " + inName + " already registered in Entity.");
  }
  std::pair<const std::string, Command *> item(inName, command);
  commandMap.insert(item);
}